

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<char,_false,_6>_> __thiscall
immutable::rrb_update<char,false,6>
          (immutable *this,ref<immutable::rrb<char,_false,_6>_> *in,uint32_t index,char element)

{
  int *piVar1;
  uint32_t uVar2;
  rrb<char,_false,_6> *prVar3;
  ref<immutable::rrb_details::internal_node<char,_false>_> rVar4;
  rrb_size_table<false> *prVar5;
  uint32_t *puVar6;
  leaf_node<char,_false> *plVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  tree_node<char,_false> *ptVar10;
  uint32_t uVar11;
  undefined8 *puVar12;
  internal_node<char,_false> *piVar13;
  undefined7 in_register_00000009;
  ulong uVar14;
  char *__function;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ref<immutable::rrb_details::internal_node<char,false>> *this_00;
  ref<immutable::rrb_details::internal_node<char,_false>_> current;
  ref<immutable::rrb_details::leaf_node<char,_false>_> leaf;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_60;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_58;
  undefined4 local_4c;
  rrb<char,_false,_6> *local_48;
  uint32_t local_3c;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_38;
  
  prVar3 = in->ptr;
  if (prVar3 != (rrb<char,_false,_6> *)0x0) {
    local_4c = (undefined4)CONCAT71(in_register_00000009,element);
    uVar15 = prVar3->cnt;
    if (uVar15 <= index) {
      __assert_fail("index < in->cnt",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x79b,
                    "ref<rrb<T, atomic_ref_counting, N>> immutable::rrb_update(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t, T) [T = char, atomic_ref_counting = false, N = 6]"
                   );
    }
    puVar12 = (undefined8 *)malloc(0x28);
    uVar8 = *(undefined8 *)prVar3;
    uVar9 = *(undefined8 *)&prVar3->tail_len;
    ptVar10 = (prVar3->root).ptr;
    puVar12[2] = (prVar3->tail).ptr;
    puVar12[3] = ptVar10;
    *puVar12 = uVar8;
    puVar12[1] = uVar9;
    puVar12[4] = *(undefined8 *)&prVar3->_ref_count;
    if (puVar12[3] != 0) {
      piVar1 = (int *)(puVar12[3] + 8);
      *piVar1 = *piVar1 + 1;
    }
    if (puVar12[2] != 0) {
      piVar1 = (int *)(puVar12[2] + 8);
      *piVar1 = *piVar1 + 1;
    }
    *(undefined8 **)this = puVar12;
    *(undefined4 *)(puVar12 + 4) = 1;
    uVar15 = uVar15 - prVar3->tail_len;
    uVar16 = (ulong)(index - uVar15);
    local_48 = (rrb<char,_false,_6> *)this;
    if (index < uVar15) {
      rVar4.ptr = (internal_node<char,_false> *)(prVar3->root).ptr;
      if (rVar4.ptr != (internal_node<char,_false> *)0x0) {
        (rVar4.ptr)->_ref_count = (rVar4.ptr)->_ref_count + 1;
      }
      this_00 = (ref<immutable::rrb_details::internal_node<char,false>> *)(puVar12 + 3);
      uVar11 = prVar3->shift;
      uVar2 = local_3c;
      while (local_3c = uVar11, local_60.ptr = rVar4.ptr, local_3c != 0) {
        uVar15 = (rVar4.ptr)->len;
        piVar13 = (internal_node<char,_false> *)malloc((ulong)uVar15 * 8 + 0x20);
        piVar13->len = uVar15;
        piVar13->type = INTERNAL_NODE;
        (piVar13->size_table).ptr = (rrb_size_table<false> *)0x0;
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar13->size_table,&(rVar4.ptr)->size_table);
        piVar13->guid = 0;
        piVar13->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar13 + 1);
        uVar15 = (rVar4.ptr)->len;
        memset(piVar13 + 1,0,(ulong)uVar15 * 8);
        if ((ulong)uVar15 != 0) {
          lVar17 = 0;
          uVar16 = 0;
          do {
            ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                      ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                       ((long)&piVar13->child->ptr + lVar17),
                       (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                       ((long)&(rVar4.ptr)->child->ptr + lVar17));
            uVar16 = uVar16 + 1;
            lVar17 = lVar17 + 8;
          } while (uVar16 < (rVar4.ptr)->len);
        }
        piVar13->_ref_count = 1;
        local_58.ptr = piVar13;
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=(&local_60,&local_58);
        rrb_details::release<char>(local_58.ptr);
        uVar2 = local_3c;
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this_00,&local_60);
        if (local_60.ptr == (internal_node<char,_false> *)0x0) {
          __function = 
          "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
          ;
          goto LAB_00151d44;
        }
        prVar5 = ((local_60.ptr)->size_table).ptr;
        uVar15 = index >> ((byte)uVar2 & 0x1f);
        if (prVar5 == (rrb_size_table<false> *)0x0) {
          uVar16 = (ulong)(uVar15 & 0x3f);
        }
        else {
          puVar6 = prVar5->size;
          uVar16 = (ulong)(uVar15 - 1);
          do {
            uVar14 = uVar16;
            uVar15 = (int)uVar14 + 1;
            uVar16 = (ulong)uVar15;
          } while (puVar6[uVar16] <= index);
          if (uVar15 == 0) {
            uVar16 = 0;
          }
          else {
            index = index - puVar6[uVar14];
          }
        }
        this_00 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                  ((local_60.ptr)->child + uVar16);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  (&local_60,(ref<immutable::rrb_details::internal_node<char,_false>_> *)this_00);
        rVar4.ptr = local_60.ptr;
        uVar11 = uVar2 - 6;
        uVar2 = local_3c;
      }
      if (rVar4.ptr != (internal_node<char,_false> *)0x0) {
        (rVar4.ptr)->_ref_count = (rVar4.ptr)->_ref_count + 1;
      }
      uVar15 = (rVar4.ptr)->len;
      local_58.ptr = rVar4.ptr;
      local_3c = uVar2;
      local_38.ptr = (leaf_node<char,_false> *)calloc(1,(ulong)uVar15 + 0x18);
      (local_38.ptr)->len = uVar15;
      (local_38.ptr)->child = (char *)(local_38.ptr + 1);
      if ((ulong)uVar15 != 0) {
        uVar16 = 0;
        do {
          (local_38.ptr)->child[uVar16] =
               *(char *)((long)&(((rVar4.ptr)->size_table).ptr)->size + uVar16);
          uVar16 = uVar16 + 1;
        } while (uVar16 < (rVar4.ptr)->len);
      }
      (local_38.ptr)->_ref_count = 1;
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58,&local_38);
      prVar3 = local_48;
      if ((local_38.ptr != (leaf_node<char,_false> *)0x0) &&
         (uVar2 = (local_38.ptr)->_ref_count, (local_38.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
        free(local_38.ptr);
      }
      ref<immutable::rrb_details::internal_node<char,false>>::operator=
                (this_00,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58);
      if (local_58.ptr != (internal_node<char,_false> *)0x0) {
        *(char *)((long)&(((local_58.ptr)->size_table).ptr)->size + (ulong)(index & 0x3f)) =
             (char)local_4c;
        if ((local_58.ptr != (internal_node<char,_false> *)0x0) &&
           (uVar2 = (local_58.ptr)->_ref_count, (local_58.ptr)->_ref_count = uVar2 - 1, uVar2 == 1))
        {
          free(local_58.ptr);
        }
        rrb_details::release<char>(local_60.ptr);
        return (ref<immutable::rrb<char,_false,_6>_>)prVar3;
      }
      __function = 
      "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
      ;
      goto LAB_00151d44;
    }
    plVar7 = (prVar3->tail).ptr;
    uVar15 = plVar7->len;
    local_60.ptr = (internal_node<char,_false> *)calloc(1,(ulong)uVar15 + 0x18);
    prVar3 = local_48;
    (local_60.ptr)->len = uVar15;
    ((local_60.ptr)->size_table).ptr = (rrb_size_table<false> *)&(local_60.ptr)->child;
    if ((ulong)uVar15 == 0) {
      (local_60.ptr)->_ref_count = 1;
      *(char *)((long)&(local_60.ptr)->child + uVar16) = (char)local_4c;
LAB_00151cea:
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar12 + 2),
                 (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_60);
      if ((local_60.ptr != (internal_node<char,_false> *)0x0) &&
         (uVar2 = (local_60.ptr)->_ref_count, (local_60.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
        free(local_60.ptr);
      }
      return (ref<immutable::rrb<char,_false,_6>_>)prVar3;
    }
    uVar14 = 0;
    do {
      *(char *)((long)&(((local_60.ptr)->size_table).ptr)->size + uVar14) = plVar7->child[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar14 < plVar7->len);
    prVar5 = ((local_60.ptr)->size_table).ptr;
    (local_60.ptr)->_ref_count = 1;
    *(char *)((long)&prVar5->size + uVar16) = (char)local_4c;
    if (puVar12 != (undefined8 *)0x0) goto LAB_00151cea;
  }
  __function = 
  "T *immutable::ref<immutable::rrb<char, false, 6>>::operator->() const [T = immutable::rrb<char, false, 6>]"
  ;
LAB_00151d44:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }